

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPolarDecomposition.cpp
# Opt level: O3

double chrono::fea::PolarDecomposition::Compute(double *M,double *Q,double *S,double tolerance)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int i;
  undefined1 (*pauVar16) [32];
  long lVar17;
  ulong *puVar18;
  int i_2;
  undefined8 *puVar19;
  double *pdVar20;
  long lVar21;
  double *pdVar22;
  int k;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar35;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 extraout_var [56];
  double norm_1;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  double norm_2;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double norm_3;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  double Mk [9];
  double Ek [9];
  undefined1 auStack_148 [12];
  ushort local_13c;
  ushort local_13a;
  ulong local_138;
  double dStack_130;
  ulong uStack_128;
  double dStack_120;
  ulong uStack_118;
  undefined1 auStack_110 [32];
  ulong uStack_f0;
  undefined1 local_e8 [16];
  double local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [64];
  undefined8 local_78;
  ulong auStack_68 [3];
  ulong auStack_50 [7];
  undefined1 auVar69 [64];
  
  local_d0 = tolerance;
  auVar25 = vpbroadcastq_avx512vl();
  auVar25 = vpaddq_avx2(auVar25,_DAT_0096f220);
  pauVar16 = (undefined1 (*) [32])&local_138;
  puVar19 = (undefined8 *)0x0;
  do {
    auVar26 = vpbroadcastq_avx512vl();
    puVar19 = (undefined8 *)((long)puVar19 + 1);
    auVar26 = vpsllq_avx2(auVar26,3);
    vpaddq_avx2(auVar25,auVar26);
    auVar26 = vgatherqpd_avx512vl(*puVar19);
    auVar26._24_8_ = *(ulong *)((long)*pauVar16 + 0x18);
    *pauVar16 = auVar26;
    pauVar16 = (undefined1 (*) [32])((long)*pauVar16 + 0x18);
  } while (puVar19 != (undefined8 *)0x3);
  auVar55._8_8_ = 0x7fffffffffffffff;
  auVar55._0_8_ = 0x7fffffffffffffff;
  auVar40 = ZEXT1664((undefined1  [16])0x0);
  lVar17 = 0;
  do {
    auVar41._8_8_ = 0;
    auVar41._0_8_ = (&local_138)[lVar17];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = (&dStack_120)[lVar17];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = *(ulong *)(auStack_110 + lVar17 * 8 + 8);
    lVar17 = lVar17 + 1;
    auVar41 = vandpd_avx(auVar55,auVar41);
    auVar24 = vandpd_avx(auVar55,auVar24);
    auVar51 = vandpd_avx(auVar55,auVar51);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auVar41._0_8_ + auVar24._0_8_ + auVar51._0_8_;
    auVar41 = vmaxsd_avx(auVar42,auVar40._0_16_);
    auVar40 = ZEXT1664(auVar41);
  } while (lVar17 != 3);
  auVar68._8_8_ = 0x7fffffffffffffff;
  auVar68._0_8_ = 0x7fffffffffffffff;
  auVar69 = ZEXT1664(auVar68);
  auVar48 = ZEXT1664(ZEXT816(0));
  lVar17 = 0x10;
  do {
    auVar41 = vandpd_avx(auVar68,*(undefined1 (*) [16])(auStack_148 + lVar17));
    auVar52._8_8_ = 0;
    auVar52._0_8_ = *(ulong *)((long)&local_138 + lVar17);
    lVar17 = lVar17 + 0x18;
    auVar24 = vandpd_avx(auVar68,auVar52);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = auVar41._0_8_ + auVar41._8_8_ + auVar24._0_8_;
    auVar41 = vmaxsd_avx(auVar49,auVar48._0_16_);
    auVar48 = ZEXT1664(auVar41);
  } while (lVar17 != 0x58);
  local_c8 = auVar55;
  local_13a = 0x40;
  local_13c = 0x20;
  while( true ) {
    auVar32._8_8_ = uStack_128;
    auVar32._0_8_ = dStack_130;
    auVar32._16_8_ = dStack_120;
    auVar32._24_8_ = uStack_118;
    auVar32._32_32_ = auStack_110;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_138;
    auVar28 = vbroadcastsd_avx512f(auVar1);
    auVar29 = vpermpd_avx512f(_DAT_0096f2c0,auVar32);
    auVar30 = vpermpd_avx512f(_DAT_0096f280,auVar32);
    lVar17 = auVar28._0_8_;
    auVar67._8_8_ = uStack_128;
    auVar67._0_8_ = lVar17;
    auVar31 = vinsertf32x4_avx512f(auVar32,auVar67,0);
    auVar32 = vpermpd_avx512f(_DAT_0096f300,auVar32);
    bVar6 = (bool)((byte)local_13a & 1);
    auVar33._0_8_ = (ulong)bVar6 * lVar17 | (ulong)!bVar6 * auVar29._0_8_;
    bVar6 = (bool)((byte)(local_13a >> 1) & 1);
    auVar33._8_8_ = (ulong)bVar6 * auVar28._8_8_ | (ulong)!bVar6 * auVar29._8_8_;
    bVar6 = (bool)((byte)(local_13a >> 2) & 1);
    auVar33._16_8_ = (ulong)bVar6 * auVar28._16_8_ | (ulong)!bVar6 * auVar29._16_8_;
    bVar6 = (bool)((byte)(local_13a >> 3) & 1);
    auVar33._24_8_ = (ulong)bVar6 * auVar28._24_8_ | (ulong)!bVar6 * auVar29._24_8_;
    bVar6 = (bool)((byte)(local_13a >> 4) & 1);
    auVar33._32_8_ = (ulong)bVar6 * auVar28._32_8_ | (ulong)!bVar6 * auVar29._32_8_;
    bVar6 = (bool)((byte)(local_13a >> 5) & 1);
    auVar33._40_8_ = (ulong)bVar6 * auVar28._40_8_ | (ulong)!bVar6 * auVar29._40_8_;
    bVar6 = (bool)((byte)(local_13a >> 6) & 1);
    auVar33._48_8_ = (ulong)bVar6 * auVar28._48_8_ | (ulong)!bVar6 * auVar29._48_8_;
    bVar6 = (bool)((byte)(local_13a >> 7) & 1);
    auVar33._56_8_ = (ulong)bVar6 * auVar28._56_8_ | (ulong)!bVar6 * auVar29._56_8_;
    auVar29 = vmulpd_avx512f(auVar33,auVar31);
    bVar6 = (bool)((byte)local_13c & 1);
    auVar31._0_8_ = (ulong)bVar6 * lVar17 | (ulong)!bVar6 * auVar32._0_8_;
    bVar6 = (bool)((byte)(local_13c >> 1) & 1);
    auVar31._8_8_ = (ulong)bVar6 * auVar28._8_8_ | (ulong)!bVar6 * auVar32._8_8_;
    bVar6 = (bool)((byte)(local_13c >> 2) & 1);
    auVar31._16_8_ = (ulong)bVar6 * auVar28._16_8_ | (ulong)!bVar6 * auVar32._16_8_;
    bVar6 = (bool)((byte)(local_13c >> 3) & 1);
    auVar31._24_8_ = (ulong)bVar6 * auVar28._24_8_ | (ulong)!bVar6 * auVar32._24_8_;
    bVar6 = (bool)((byte)(local_13c >> 4) & 1);
    auVar31._32_8_ = (ulong)bVar6 * auVar28._32_8_ | (ulong)!bVar6 * auVar32._32_8_;
    bVar6 = (bool)((byte)(local_13c >> 5) & 1);
    auVar31._40_8_ = (ulong)bVar6 * auVar28._40_8_ | (ulong)!bVar6 * auVar32._40_8_;
    bVar6 = (bool)((byte)(local_13c >> 6) & 1);
    auVar31._48_8_ = (ulong)bVar6 * auVar28._48_8_ | (ulong)!bVar6 * auVar32._48_8_;
    bVar6 = (bool)((byte)(local_13c >> 7) & 1);
    auVar31._56_8_ = (ulong)bVar6 * auVar28._56_8_ | (ulong)!bVar6 * auVar32._56_8_;
    auVar32 = vfmsub213pd_avx512f(auVar31,auVar30,auVar29);
    local_b8 = vpermpd_avx512f(_DAT_0096f340,auVar32);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uStack_118;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dStack_130 * dStack_120;
    auVar41 = vfmsub231sd_fma(auVar59,auVar28._0_16_,auVar2);
    local_78 = auVar41._0_8_;
    auVar24 = vextractf32x4_avx512f(auVar32,2);
    auVar41 = vshufpd_avx(auVar32._16_16_,auVar32._16_16_,1);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = auVar32._16_8_ * dStack_130;
    auVar24 = vfmadd213sd_fma(auVar24,auVar28._0_16_,auVar64);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uStack_128;
    local_e8 = vfmadd132sd_fma(auVar41,auVar24,auVar3);
    if ((local_e8._0_8_ == 0.0) && (!NAN(local_e8._0_8_))) break;
    auVar41 = ZEXT816(0) << 0x40;
    lVar17 = 0;
    do {
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)(local_b8 + lVar17 * 8);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(ulong *)(local_b8 + lVar17 * 8 + 0x18);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)(local_b8 + lVar17 * 8 + 0x30);
      lVar17 = lVar17 + 1;
      auVar24 = vandpd_avx(auVar55,auVar53);
      auVar51 = vandpd_avx(auVar55,auVar60);
      auVar42 = vandpd_avx(auVar55,auVar65);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = auVar24._0_8_ + auVar51._0_8_ + auVar42._0_8_;
      auVar41 = vmaxsd_avx(auVar54,auVar41);
    } while (lVar17 != 3);
    auVar55 = ZEXT816(0);
    lVar17 = 0x10;
    do {
      auVar24 = vandpd_avx(auVar69._0_16_,*(undefined1 (*) [16])(local_c8 + lVar17));
      auVar66._8_8_ = 0;
      auVar66._0_8_ = *(ulong *)(local_b8 + lVar17);
      lVar17 = lVar17 + 0x18;
      auVar51 = vandpd_avx(auVar69._0_16_,auVar66);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = auVar24._0_8_ + auVar24._8_8_ + auVar51._0_8_;
      auVar55 = vmaxsd_avx(auVar61,auVar55);
    } while (lVar17 != 0x58);
    auVar36._0_8_ = (auVar41._0_8_ * auVar55._0_8_) / (auVar48._0_8_ * auVar40._0_8_);
    auVar36._8_8_ = 0;
    if (auVar36._0_8_ < 0.0) {
      auVar40._0_8_ = sqrt(auVar36._0_8_);
      auVar40._8_56_ = extraout_var;
      auVar55 = auVar40._0_16_;
      auVar69 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    }
    else {
      auVar55 = vsqrtsd_avx(auVar36,auVar36);
    }
    auVar41 = vandpd_avx(auVar69._0_16_,local_e8);
    auVar37._0_8_ = auVar55._0_8_ / auVar41._0_8_;
    auVar37._8_8_ = auVar55._8_8_;
    if (auVar37._0_8_ < 0.0) {
      dVar35 = sqrt(auVar37._0_8_);
      auVar69 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    }
    else {
      auVar55 = vsqrtsd_avx(auVar37,auVar37);
      dVar35 = auVar55._0_8_;
      local_e8._0_8_ = local_e8._0_8_;
    }
    auVar55 = local_c8;
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar48 = vpbroadcastq_avx512f(ZEXT816(9));
    lVar17 = 0;
    auVar43._0_8_ = 0.5 / ((double)local_e8._0_8_ * dVar35);
    auVar43._8_8_ = 0;
    auVar32 = vbroadcastsd_avx512f(auVar43);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = dVar35 * 0.5;
    auVar28 = vbroadcastsd_avx512f(auVar50);
    do {
      auVar29 = vpbroadcastq_avx512f();
      auVar29 = vporq_avx512f(auVar29,auVar40);
      uVar12 = vpcmpuq_avx512f(auVar29,auVar48,1);
      lVar21 = lVar17 * 8;
      bVar5 = (byte)uVar12;
      auVar29._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * *(long *)(local_b8 + lVar21 + 8);
      auVar29._0_8_ = (ulong)(bVar5 & 1) * *(long *)(local_b8 + lVar21);
      auVar29._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * *(long *)(local_b8 + lVar21 + 0x10);
      auVar29._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * *(long *)(local_b8 + lVar21 + 0x18);
      auVar29._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * *(long *)(local_b8 + lVar21 + 0x20);
      auVar29._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * *(long *)(local_b8 + lVar21 + 0x28);
      auVar29._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * *(long *)(local_b8 + lVar21 + 0x30);
      auVar29._56_8_ = (uVar12 >> 7) * *(long *)(local_b8 + lVar21 + 0x38);
      lVar21 = lVar17 * 8;
      auVar30._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * (long)(&dStack_130)[lVar17];
      auVar30._0_8_ = (ulong)(bVar5 & 1) * (&local_138)[lVar17];
      auVar30._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * (&uStack_128)[lVar17];
      auVar30._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * (long)(&dStack_120)[lVar17];
      auVar30._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * *(long *)(auStack_110 + lVar21 + -8);
      auVar30._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * *(long *)(auStack_110 + lVar21);
      auVar30._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * *(long *)(auStack_110 + lVar21 + 8);
      auVar30._56_8_ = (uVar12 >> 7) * *(long *)(auStack_110 + lVar21 + 0x10);
      auVar29 = vmulpd_avx512f(auVar32,auVar29);
      auVar29 = vfmadd231pd_avx512f(auVar29,auVar28,auVar30);
      auVar30 = vsubpd_avx512f(auVar30,auVar29);
      lVar21 = lVar17 * 8;
      lVar23 = *(long *)(auStack_110 + lVar21 + -8);
      lVar13 = *(long *)(auStack_110 + lVar21);
      lVar14 = *(long *)(auStack_110 + lVar21 + 8);
      lVar15 = *(long *)(auStack_110 + lVar21 + 0x10);
      bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
      (&local_138)[lVar17] =
           (ulong)(bVar5 & 1) * auVar29._0_8_ | (ulong)!(bool)(bVar5 & 1) * (&local_138)[lVar17];
      (&dStack_130)[lVar17] =
           (double)((ulong)bVar6 * auVar29._8_8_ | (ulong)!bVar6 * (long)(&dStack_130)[lVar17]);
      (&uStack_128)[lVar17] = (ulong)bVar7 * auVar29._16_8_ | (ulong)!bVar7 * (&uStack_128)[lVar17];
      (&dStack_120)[lVar17] =
           (double)((ulong)bVar8 * auVar29._24_8_ | (ulong)!bVar8 * (long)(&dStack_120)[lVar17]);
      *(ulong *)(auStack_110 + lVar21 + -8) = (ulong)bVar9 * auVar29._32_8_ | (ulong)!bVar9 * lVar23
      ;
      *(ulong *)(auStack_110 + lVar21) = (ulong)bVar10 * auVar29._40_8_ | (ulong)!bVar10 * lVar13;
      *(ulong *)(auStack_110 + lVar21 + 8) =
           (ulong)bVar11 * auVar29._48_8_ | (ulong)!bVar11 * lVar14;
      *(ulong *)(auStack_110 + lVar21 + 0x10) =
           (uVar12 >> 7) * auVar29._56_8_ | (ulong)!SUB81(uVar12 >> 7,0) * lVar15;
      auVar29 = *(undefined1 (*) [64])(auStack_68 + lVar17);
      auVar34._0_8_ = (ulong)(bVar5 & 1) * auVar30._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar29._0_8_
      ;
      bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar34._8_8_ = (ulong)bVar6 * auVar30._8_8_ | (ulong)!bVar6 * auVar29._8_8_;
      bVar6 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar34._16_8_ = (ulong)bVar6 * auVar30._16_8_ | (ulong)!bVar6 * auVar29._16_8_;
      bVar6 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar34._24_8_ = (ulong)bVar6 * auVar30._24_8_ | (ulong)!bVar6 * auVar29._24_8_;
      bVar6 = (bool)((byte)(uVar12 >> 4) & 1);
      auVar34._32_8_ = (ulong)bVar6 * auVar30._32_8_ | (ulong)!bVar6 * auVar29._32_8_;
      bVar6 = (bool)((byte)(uVar12 >> 5) & 1);
      auVar34._40_8_ = (ulong)bVar6 * auVar30._40_8_ | (ulong)!bVar6 * auVar29._40_8_;
      bVar6 = (bool)((byte)(uVar12 >> 6) & 1);
      auVar34._48_8_ = (ulong)bVar6 * auVar30._48_8_ | (ulong)!bVar6 * auVar29._48_8_;
      auVar34._56_8_ =
           (uVar12 >> 7) * auVar30._56_8_ | (ulong)!SUB81(uVar12 >> 7,0) * auVar29._56_8_;
      *(undefined1 (*) [64])(auStack_68 + lVar17) = auVar34;
      lVar17 = lVar17 + 8;
    } while (lVar17 != 0x10);
    auVar41 = ZEXT816(0);
    lVar17 = -0x18;
    do {
      auVar38._8_8_ = 0;
      auVar38._0_8_ = *(ulong *)((long)auStack_50 + lVar17);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)((long)auStack_50 + lVar17 + 0x18);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = *(ulong *)((long)auStack_50 + lVar17 + 0x30);
      lVar17 = lVar17 + 8;
      auVar24 = vandpd_avx(auVar55,auVar38);
      auVar51 = vandpd_avx(auVar55,auVar44);
      auVar42 = vandpd_avx(auVar55,auVar56);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = auVar24._0_8_ + auVar51._0_8_ + auVar42._0_8_;
      auVar41 = vmaxsd_avx(auVar39,auVar41);
    } while (lVar17 != 0);
    auVar40 = ZEXT1664(ZEXT816(0));
    lVar17 = -0x18;
    do {
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)((long)&dStack_120 + lVar17);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(ulong *)(auStack_110 + lVar17 + 8);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = *(ulong *)((long)&uStack_f0 + lVar17);
      lVar17 = lVar17 + 8;
      auVar24 = vandpd_avx(auVar55,auVar45);
      auVar51 = vandpd_avx(auVar55,auVar57);
      auVar42 = vandpd_avx(auVar55,auVar62);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = auVar24._0_8_ + auVar51._0_8_ + auVar42._0_8_;
      auVar24 = vmaxsd_avx(auVar46,auVar40._0_16_);
      auVar40 = ZEXT1664(auVar24);
    } while (lVar17 != 0);
    auVar48 = ZEXT1664(ZEXT816(0));
    lVar17 = 0x10;
    do {
      auVar51 = vandpd_avx(auVar69._0_16_,*(undefined1 (*) [16])(auStack_148 + lVar17));
      auVar63._8_8_ = 0;
      auVar63._0_8_ = *(ulong *)((long)&local_138 + lVar17);
      lVar17 = lVar17 + 0x18;
      auVar42 = vandpd_avx(auVar69._0_16_,auVar63);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = auVar51._0_8_ + auVar51._8_8_ + auVar42._0_8_;
      auVar51 = vmaxsd_avx(auVar58,auVar48._0_16_);
      auVar48 = ZEXT1664(auVar51);
    } while (lVar17 != 0x58);
    if ((((double)local_e8._0_8_ == 0.0) && (!NAN((double)local_e8._0_8_))) ||
       (auVar41._0_8_ <= auVar24._0_8_ * local_d0)) goto LAB_0061944d;
  }
  puts("Warning (polarDecomposition) : zero determinant encountered.");
LAB_0061944d:
  auVar25 = vpmovsxbq_avx2(ZEXT416(0x60300));
  lVar17 = 0;
  puVar18 = &local_138;
  do {
    auVar26 = vpbroadcastq_avx512vl();
    lVar17 = lVar17 + 1;
    vpaddq_avx2(auVar26,auVar25);
    auVar26 = vgatherqpd_avx512vl(puVar18[lVar17]);
    auVar27._0_24_ = auVar26._0_24_;
    auVar27._24_8_ = SUB328(*(undefined1 (*) [32])Q,0x18);
    *(undefined1 (*) [32])Q = auVar27;
    Q = (double *)(*(undefined1 (*) [32])Q + 0x18);
  } while (lVar17 != 3);
  lVar17 = 0;
  do {
    lVar21 = 0;
    pdVar20 = M;
    do {
      auVar40 = ZEXT1664((undefined1  [16])0x0);
      S[lVar17 * 3 + lVar21] = 0.0;
      lVar23 = 0;
      pdVar22 = pdVar20;
      do {
        auVar47._8_8_ = 0;
        auVar47._0_8_ = puVar18[lVar23];
        lVar23 = lVar23 + 1;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *pdVar22;
        auVar55 = vfmadd231sd_fma(auVar40._0_16_,auVar47,auVar4);
        auVar40 = ZEXT1664(auVar55);
        pdVar22 = pdVar22 + 3;
        S[lVar17 * 3 + lVar21] = auVar55._0_8_;
      } while (lVar23 != 3);
      lVar21 = lVar21 + 1;
      pdVar20 = pdVar20 + 1;
    } while (lVar21 != 3);
    lVar17 = lVar17 + 1;
    puVar18 = puVar18 + 3;
  } while (lVar17 != 3);
  lVar17 = 0x48;
  lVar21 = 0;
  do {
    lVar23 = 0;
    pdVar20 = S;
    do {
      dVar35 = (*pdVar20 + *(double *)((long)S + lVar23)) * 0.5;
      *(double *)((long)S + lVar23) = dVar35;
      *pdVar20 = dVar35;
      pdVar20 = pdVar20 + 1;
      lVar23 = lVar23 + 0x18;
    } while (lVar17 != lVar23);
    lVar21 = lVar21 + 1;
    S = S + 4;
    lVar17 = lVar17 + -0x18;
  } while (lVar21 != 3);
  return (double)local_e8._0_8_;
}

Assistant:

double PolarDecomposition::Compute(const double* M, double* Q, double* S, double tolerance) {
    double Mk[9];
    double Ek[9];
    double det, M_oneNorm, M_infNorm, E_oneNorm;

    // Mk = M^T
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            Mk[3 * i + j] = M[3 * j + i];

    M_oneNorm = oneNorm(Mk);
    M_infNorm = infNorm(Mk);

    do {
        double MadjTk[9];

        // row 2 x row 3
        crossProduct(&(Mk[3]), &(Mk[6]), &(MadjTk[0]));
        // row 3 x row 1
        crossProduct(&(Mk[6]), &(Mk[0]), &(MadjTk[3]));
        // row 1 x row 2
        crossProduct(&(Mk[0]), &(Mk[3]), &(MadjTk[6]));

        det = Mk[0] * MadjTk[0] + Mk[1] * MadjTk[1] + Mk[2] * MadjTk[2];
        if (det == 0.0) {
            printf("Warning (polarDecomposition) : zero determinant encountered.\n");
            break;
        }

        double MadjT_one = oneNorm(MadjTk);
        double MadjT_inf = infNorm(MadjTk);

        double gamma = sqrt(sqrt((MadjT_one * MadjT_inf) / (M_oneNorm * M_infNorm)) / fabs(det));
        double g1 = gamma * 0.5;
        double g2 = 0.5 / (gamma * det);

        for (int i = 0; i < 9; i++) {
            Ek[i] = Mk[i];
            Mk[i] = g1 * Mk[i] + g2 * MadjTk[i];
            Ek[i] -= Mk[i];
        }

        E_oneNorm = oneNorm(Ek);
        M_oneNorm = oneNorm(Mk);
        M_infNorm = infNorm(Mk);
    } while (E_oneNorm > M_oneNorm * tolerance);

    // Q = Mk^T
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            Q[3 * i + j] = Mk[3 * j + i];

    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++) {
            S[3 * i + j] = 0;
            for (int k = 0; k < 3; k++)
                S[3 * i + j] += Mk[3 * i + k] * M[3 * k + j];
        }

    // S must be symmetric; enforce the symmetry
    for (int i = 0; i < 3; i++)
        for (int j = i; j < 3; j++)
            S[3 * i + j] = S[3 * j + i] = 0.5 * (S[3 * i + j] + S[3 * j + i]);

    return (det);
}